

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  char *pcVar2;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar3;
  NumericExpr rhs;
  int iVar4;
  NumericExpr lhs;
  CountExpr rhs_00;
  LogicalExpr LVar5;
  LogicalExpr LVar6;
  LogicalExpr then_expr;
  LogicalExpr else_expr;
  BinaryReader<mp::internal::IdentityConverter> *this_00;
  PairwiseArgHandler PVar7;
  LogicalArgHandler LVar8;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::LogicalExprReader>
  args;
  
  kind = OpCodeInfo::INFO[opcode].kind;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar1) {
  case ATLEAST:
    lhs = ReadNumericExpr(this,false);
    this_00 = this->reader_;
    pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
    (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
    if (*pcVar2 == 'o') {
      iVar4 = ReadOpCode(this);
      if (OpCodeInfo::INFO[iVar4].kind == COUNT) goto LAB_001c7565;
      this_00 = this->reader_;
    }
    BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x1ee4ca);
LAB_001c7565:
    pNVar3 = this->handler_;
    rhs_00 = ReadCountExpr(this);
    LVar6 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLogicalCount
                      (pNVar3,kind,(NumericExpr)lhs.super_ExprBase.impl_,rhs_00);
    return (LogicalExpr)LVar6.super_ExprBase.impl_;
  case IMPLICATION:
    LVar5 = ReadLogicalExpr(this);
    then_expr = ReadLogicalExpr(this);
    else_expr = ReadLogicalExpr(this);
    LVar6 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnImplication
                      (this->handler_,(LogicalExpr)LVar5.super_ExprBase.impl_,
                       (LogicalExpr)then_expr.super_ExprBase.impl_,
                       (LogicalExpr)else_expr.super_ExprBase.impl_);
    return (LogicalExpr)LVar6.super_ExprBase.impl_;
  case EXISTS:
    iVar4 = ReadNumArgs(this,3);
    LVar8 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginIteratedLogical
                      (this->handler_,kind,iVar4);
    args.lhs.super_ExprBase.impl_ = (ExprBase)LVar8.impl_;
    args.rhs.super_ExprBase.impl_._0_4_ = LVar8.arg_index_;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::LogicalExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar4,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
                *)&args);
    break;
  case ALLDIFF:
    iVar4 = ReadNumArgs(this,1);
    PVar7 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginPairwise
                      (this->handler_,kind,iVar4);
    args.lhs.super_ExprBase.impl_ = (ExprBase)PVar7.impl_;
    args.rhs.super_ExprBase.impl_._0_4_ = PVar7.arg_index_;
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::NumericExprReader,mp::BasicExprFactory<std::allocator<char>>::BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                *)this,iVar4,
               (BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
                *)&args);
    break;
  default:
    if (KVar1 == FIRST_RELATIONAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::NumericExprReader>
                         *)&args,this);
      rhs.super_ExprBase.impl_._4_4_ = args.rhs.super_ExprBase.impl_._4_4_;
      rhs.super_ExprBase.impl_._0_4_ = (int)args.rhs.super_ExprBase.impl_;
      LVar6 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnRelational
                        (this->handler_,kind,(NumericExpr)args.lhs.super_ExprBase.impl_,rhs);
      return (LogicalExpr)(Impl *)LVar6.super_ExprBase.impl_;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>::LogicalExprReader>
      ::BinaryArgReader(&args,this);
      LVar6.super_ExprBase.impl_._4_4_ = args.rhs.super_ExprBase.impl_._4_4_;
      LVar6.super_ExprBase.impl_._0_4_ = (int)args.rhs.super_ExprBase.impl_;
      LVar6 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBinaryLogical
                        (this->handler_,kind,(LogicalExpr)args.lhs.super_ExprBase.impl_,LVar6);
      return (LogicalExpr)(Impl *)LVar6.super_ExprBase.impl_;
    }
    if (KVar1 == NOT) {
      pNVar3 = this->handler_;
      LVar5 = ReadLogicalExpr(this);
      LVar6 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnNot
                        (pNVar3,(LogicalExpr)LVar5.super_ExprBase.impl_);
      return (LogicalExpr)LVar6.super_ExprBase.impl_;
    }
  case ATMOST:
  case EXACTLY:
  case NOT_ATLEAST:
  case NOT_ATMOST:
  case LAST_LOGICAL_COUNT:
  case FORALL:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x1ee4e4);
    args.lhs.super_ExprBase.impl_ = (ExprBase)(Impl *)0x0;
  }
  return (LogicalExpr)args.lhs.super_ExprBase.impl_;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}